

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

EdgeIdx __thiscall Escape::CGraph::getEdgeCount(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  long lVar1;
  VertexIdx *pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (this->nVertices <= v1) {
    return -1;
  }
  lVar6 = this->offsets[v1];
  lVar7 = this->offsets[v1 + 1];
  if (lVar7 <= lVar6) {
    return -1;
  }
  lVar7 = lVar7 + -1;
  pVVar2 = this->nbors;
  while( true ) {
    lVar5 = (lVar7 + lVar6) / 2;
    lVar4 = pVVar2[lVar5];
    if (lVar4 == v2) break;
    if (lVar4 == v2 || lVar4 < v2) {
      lVar6 = lVar5 + 1;
    }
    else {
      lVar7 = lVar5 + -1;
    }
    if (lVar7 < lVar6) {
      return -1;
    }
  }
  lVar3 = 1;
  lVar4 = lVar3;
  if (lVar5 < lVar7) {
    do {
      lVar4 = lVar3;
      if (pVVar2[lVar5 + lVar3] != v2) break;
      lVar1 = (lVar5 - lVar7) + lVar3;
      lVar3 = lVar3 + 1;
      lVar4 = (lVar7 - lVar5) + 1;
    } while (lVar1 != 0);
  }
  if (lVar6 < lVar5) {
    lVar7 = lVar4 + lVar5;
    while (pVVar2[lVar5 + -1] == v2) {
      lVar5 = lVar5 + -1;
      lVar4 = lVar4 + 1;
      if (lVar5 <= lVar6) {
        return lVar7 - lVar6;
      }
    }
  }
  return lVar4;
}

Assistant:

EdgeIdx CGraph::getEdgeCount(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;
    EdgeIdx found, multiplicity=0;

    while (low <= high) {
        mid = (low + high) / 2;
        if (nbors[mid] == v2) {
            multiplicity = 1;
            found = mid+1;
            while ( found <= high && nbors[found] == v2) {
                multiplicity++;
                found ++;
            }
            found = mid-1;
            while ( found >= low && nbors[found] == v2) {
                multiplicity ++;
                found --;
            }
            return multiplicity;
        }
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return -1;
}